

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O3

TSMetadataList waitForNextMetadata(SstStream Stream,ssize_t LastTimestep)

{
  long lVar1;
  size_t sVar2;
  _TimestepMetadataMsg **pp_Var3;
  __pid_t _Var4;
  pthread_t pVar5;
  ssize_t sVar6;
  char *Format;
  TSMetadataList p_Var7;
  
  CP_verbose(Stream,PerRankVerbose,"Wait for next metadata after last timestep %ld\n",LastTimestep);
  while( true ) {
    p_Var7 = Stream->Timesteps;
    while (p_Var7 != (TSMetadataList)0x0) {
      CP_verbose(Stream,TraceVerbose,"Examining metadata for timestep %ld\n",
                 p_Var7->MetadataMsg->Timestep);
      lVar1 = p_Var7->MetadataMsg->Timestep;
      if ((p_Var7->MetadataMsg->Metadata == (SstData)0x0) || (lVar1 < Stream->DiscardPriorTimestep))
      {
        CP_verbose(Stream,PerRankVerbose,
                   "SstAdvanceStep installing precious metadata for discarded TS %ld\n");
        sVar2 = Stream->WriterConfigParams->MarshalMethod;
        if (sVar2 == 2) {
          AddFormatsToMetaMetaInfo(Stream,p_Var7->MetadataMsg);
          AddAttributesToAttrDataList(Stream,p_Var7->MetadataMsg);
        }
        else if (sVar2 == 0) {
          FFSMarshalInstallPreciousMetadata(Stream,p_Var7->MetadataMsg);
        }
        pp_Var3 = &p_Var7->MetadataMsg;
        p_Var7 = p_Var7->Next;
        FreeTimestep(Stream,(*pp_Var3)->Timestep);
      }
      else {
        if (LastTimestep < lVar1) {
          CP_verbose(Stream,PerRankVerbose,"Returning metadata for timestep %ld\n");
          sVar6 = p_Var7->MetadataMsg->Timestep;
          goto LAB_0072dd84;
        }
        p_Var7 = p_Var7->Next;
      }
    }
    lVar1 = Stream->FinalTimestep;
    if ((Stream->Status != Established) || (LastTimestep <= lVar1 && lVar1 != 0x7fffffffffffffff))
    break;
    CP_verbose(Stream,PerRankVerbose,"Waiting for metadata for a Timestep later than TS %ld\n",
               LastTimestep);
    _Var4 = getpid();
    pVar5 = pthread_self();
    CP_verbose(Stream,TraceVerbose,"(PID %lx, TID %lx) Stream status is %s\n",(long)_Var4,pVar5,
               SSTStreamStatusStr[Stream->Status]);
    pthread_cond_wait((pthread_cond_t *)&Stream->DataCondition,(pthread_mutex_t *)&Stream->DataLock)
    ;
  }
  CP_verbose(Stream,TraceVerbose,"Stream Final Timestep is %ld, last timestep was %ld\n",lVar1,
             LastTimestep);
  if (Stream->Status == PeerFailed) {
    Format = 
    "Wait for next metadata returning NULL because the connection failed before final timestep notification\n"
    ;
  }
  else {
    if (Stream->Status != NotOpen) {
      CP_verbose(Stream,PerStepVerbose,"Wait for next metadata returning NULL, status %d ");
      goto LAB_0072dd7d;
    }
    Format = "Wait for next metadata returning NULL because channel was never fully established\n";
  }
  CP_verbose(Stream,PerRankVerbose,Format);
LAB_0072dd7d:
  p_Var7 = (TSMetadataList)0x0;
  sVar6 = -1;
LAB_0072dd84:
  Stream->CurrentWorkingTimestep = sVar6;
  return p_Var7;
}

Assistant:

static TSMetadataList waitForNextMetadata(SstStream Stream, ssize_t LastTimestep)
{
    TSMetadataList FoundTS = NULL;
    CP_verbose(Stream, PerRankVerbose, "Wait for next metadata after last timestep %ld\n",
               LastTimestep);
    while (1)
    {
        struct _TimestepMetadataList *Next;
        Next = Stream->Timesteps;
        while (Next)
        {
            CP_verbose(Stream, TraceVerbose, "Examining metadata for timestep %ld\n",
                       Next->MetadataMsg->Timestep);
            if (((Next->MetadataMsg->Metadata == NULL) ||
                 (Next->MetadataMsg->Timestep < Stream->DiscardPriorTimestep)) &&
                (FoundTS == NULL))
            {
                /*
                 * Either this is a dummy timestep for something that
                 * was discarded on the writer side, or it is a
                 * timestep that satisfies DiscardPriorTimestep and
                 * we've already sent a release for it.  Now is the
                 * time to install the 'precious' info that it carried
                 * (Attributes and formats) and then discard it.
                 */
                CP_verbose(Stream, PerRankVerbose,
                           "SstAdvanceStep installing precious "
                           "metadata for discarded TS %ld\n",
                           Next->MetadataMsg->Timestep);
                if (Stream->WriterConfigParams->MarshalMethod == SstMarshalFFS)
                {
                    FFSMarshalInstallPreciousMetadata(Stream, Next->MetadataMsg);
                }
                else if (Stream->WriterConfigParams->MarshalMethod == SstMarshalBP5)
                {
                    AddFormatsToMetaMetaInfo(Stream, Next->MetadataMsg);
                    AddAttributesToAttrDataList(Stream, Next->MetadataMsg);
                }
                TSMetadataList Tmp = Next;
                Next = Next->Next;
                FreeTimestep(Stream, Tmp->MetadataMsg->Timestep);
                continue;
            }
            if (Next->MetadataMsg->Timestep >= LastTimestep)
            {
                if ((FoundTS == NULL) && (Next->MetadataMsg->Timestep > LastTimestep))
                {
                    FoundTS = Next;
                    break;
                }
                else if ((FoundTS != NULL) &&
                         (FoundTS->MetadataMsg->Timestep > Next->MetadataMsg->Timestep))
                {
                    FoundTS = Next;
                    break;
                }
            }
            Next = Next->Next;
        }
        if (FoundTS)
        {
            CP_verbose(Stream, PerRankVerbose, "Returning metadata for timestep %ld\n",
                       FoundTS->MetadataMsg->Timestep);
            Stream->CurrentWorkingTimestep = FoundTS->MetadataMsg->Timestep;
            return FoundTS;
        }
        /* didn't find a good next timestep, check Stream status */
        if ((Stream->Status != Established) ||
            ((Stream->FinalTimestep != SSIZE_T_MAX) && (Stream->FinalTimestep >= LastTimestep)))
        {
            CP_verbose(Stream, TraceVerbose,
                       "Stream Final Timestep is %ld, last timestep was %ld\n",
                       Stream->FinalTimestep, LastTimestep);
            if (Stream->Status == NotOpen)
            {
                CP_verbose(Stream, PerRankVerbose,
                           "Wait for next metadata returning NULL because "
                           "channel was never fully established\n");
            }
            else if (Stream->Status == PeerFailed)
            {
                CP_verbose(Stream, PerRankVerbose,
                           "Wait for next metadata returning NULL because "
                           "the connection failed before final timestep "
                           "notification\n");
            }
            else
            {
                CP_verbose(Stream, PerStepVerbose,
                           "Wait for next metadata returning NULL, status %d ", Stream->Status);
            }
            /* closed or failed, return NULL */
            Stream->CurrentWorkingTimestep = -1;
            return NULL;
        }
        CP_verbose(Stream, PerRankVerbose,
                   "Waiting for metadata for a Timestep later than TS %ld\n", LastTimestep);
        CP_verbose(Stream, TraceVerbose, "(PID %lx, TID %lx) Stream status is %s\n",
                   (unsigned long)getpid(), (unsigned long)gettid(),
                   SSTStreamStatusStr[Stream->Status]);
        /* wait until we get the timestep metadata or something else changes */
        STREAM_CONDITION_WAIT(Stream);
    }
    /* NOTREACHED */
}